

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_pretty(Mesh *this)

{
  bool bVar1;
  VertexIter this_00;
  reference pvVar2;
  pointer pVVar3;
  size_type sVar4;
  long in_RDI;
  VertexIter v_2;
  Spectrum white;
  VertexIter v_1;
  int i;
  Vector3D offset;
  VertexIter v;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  HalfedgeMesh *in_stack_fffffffffffffec8;
  Vector3D *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_stack_fffffffffffffee0;
  _Self local_d8;
  _Self local_d0;
  Spectrum local_c4;
  _List_node_base *local_b8;
  _Self in_stack_ffffffffffffff50;
  _Self local_a8;
  int local_9c;
  _List_node_base *local_98;
  double in_stack_ffffffffffffff88;
  undefined1 smooth;
  Mesh *in_stack_ffffffffffffff90;
  _Self local_58 [3];
  _Self local_40;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_38;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_20;
  
  check_finite_positions((Mesh *)in_stack_ffffffffffffff50._M_node);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x1fecde);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x1feceb);
  local_40._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(in_stack_fffffffffffffec8);
  while( true ) {
    local_58[0]._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(in_stack_fffffffffffffec8);
    bVar1 = std::operator!=(&local_40,local_58);
    if (!bVar1) break;
    std::_List_iterator<CMU462::Vertex>::operator->
              ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffed0);
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pVVar3 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffed0);
    in_stack_ffffffffffffff88 = (double)pVVar3->offset;
    std::_List_iterator<CMU462::Vertex>::operator->
              ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffed0);
    Vertex::normal((Vertex *)v_2._M_node);
    CMU462::operator*(&in_stack_fffffffffffffed8->x,in_stack_fffffffffffffed0);
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_98 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_40,0);
  }
  local_9c = 0;
  local_a8._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(in_stack_fffffffffffffec8);
  while( true ) {
    HalfedgeMesh::verticesEnd(in_stack_fffffffffffffec8);
    bVar1 = std::operator!=(&local_a8,(_Self *)&stack0xffffffffffffff50);
    smooth = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
    if (!bVar1) break;
    sVar4 = (size_type)local_9c;
    local_9c = local_9c + 1;
    pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       (&local_20,sVar4);
    pVVar3 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffed0);
    Vector3D::operator+=(&pVVar3->position,pvVar2);
    local_b8 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_a8,0);
  }
  glPushMatrix();
  glTranslatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x10) >> 0x20),
                        (float)*(double *)(in_RDI + 0x10)),
               CONCAT44((int)((ulong)*(double *)(in_RDI + 0x18) >> 0x20),
                        (float)*(double *)(in_RDI + 0x18)),
               CONCAT44((int)((ulong)*(double *)(in_RDI + 0x20) >> 0x20),
                        (float)*(double *)(in_RDI + 0x20)));
  glRotatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x28) >> 0x20),
                     (float)*(double *)(in_RDI + 0x28)),0x3f800000,0);
  glRotatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x30) >> 0x20),
                     (float)*(double *)(in_RDI + 0x30)),0,0x3f800000);
  glRotatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x38) >> 0x20),
                     (float)*(double *)(in_RDI + 0x38)),0,0,0x3f800000);
  glScalef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x40) >> 0x20),
                    (float)*(double *)(in_RDI + 0x40)),
           CONCAT44((int)((ulong)*(double *)(in_RDI + 0x48) >> 0x20),
                    (float)*(double *)(in_RDI + 0x48)),
           CONCAT44((int)((ulong)*(double *)(in_RDI + 0x50) >> 0x20),
                    (float)*(double *)(in_RDI + 0x50)));
  if (*(long *)(in_RDI + 0x228) == 0) {
    glBindTexture(0xde1,0);
    Spectrum::Spectrum(&local_c4,1.0,1.0,1.0);
    glMaterialfv(0x404,0x1201,&local_c4);
  }
  else {
    glBindTexture(0xde1,0);
    glMaterialfv(0x404,0x1201,*(long *)(in_RDI + 0x228) + 8);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  draw_faces(in_stack_ffffffffffffff90,(bool)smooth);
  glPopMatrix();
  local_9c = 0;
  this_00 = HalfedgeMesh::verticesBegin(in_stack_fffffffffffffec8);
  local_d0._M_node = this_00._M_node;
  while( true ) {
    local_d8._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(in_stack_fffffffffffffec8);
    bVar1 = std::operator!=(&local_d0,&local_d8);
    if (!bVar1) break;
    sVar4 = (size_type)local_9c;
    local_9c = local_9c + 1;
    pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       (&local_38,sVar4);
    pVVar3 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)pvVar2);
    (pVVar3->position).x = pvVar2->x;
    (pVVar3->position).y = pvVar2->y;
    (pVVar3->position).z = pvVar2->z;
    std::_List_iterator<CMU462::Vertex>::operator++(&local_d0,0);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)this_00._M_node);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)this_00._M_node);
  return;
}

Assistant:

void Mesh::draw_pretty() {

  check_finite_positions();

  vector<Vector3D> offsets;
  vector<Vector3D> originalPositions;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  if (bsdf) {
    glBindTexture(GL_TEXTURE_2D, 0);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &bsdf->rasterize_color.r);
  } else {
    glBindTexture(GL_TEXTURE_2D, 0);
    Spectrum white = Spectrum(1., 1., 1.);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &white.r);
  }

  // Enable lighting for faces
  glEnable(GL_LIGHTING);
  glDisable(GL_BLEND);
  draw_faces(true);

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }
}